

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::print<char[29],int&,int,char>(FILE *f,char (*format_str) [29],int *args,int *args_1)

{
  basic_string_view<char> format_str_00;
  format_args args_00;
  ulong local_38 [2];
  ulong local_28;
  
  local_38[0] = (ulong)(uint)*args;
  local_28 = (ulong)(uint)*args_1;
  format_str_00 = to_string_view<char,_0>(*format_str);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_38;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x11;
  vprint(f,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}